

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCall
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this,string *id)

{
  DeferCommands *pDVar1;
  size_t __n;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  DeferCommand *dc;
  pointer pDVar5;
  cmListFileArgument *arg;
  pointer pDVar6;
  undefined8 *puVar7;
  bool bVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  pointer local_c0;
  string *local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pDVar1 = (this->Defer)._M_t.
           super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
           .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (pDVar1 != (DeferCommands *)0x0) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    pDVar5 = *(pointer *)
              &(pDVar1->Commands).
               super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
    ;
    pDVar6 = *(pointer *)
              ((long)&(pDVar1->Commands).
                      super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
              + 8);
    if (pDVar5 != pDVar6) {
      local_c0 = pDVar6;
      local_b8 = id;
      do {
        while( true ) {
          __n = (pDVar5->Id)._M_string_length;
          if (__n == id->_M_string_length) {
            if (__n == 0) {
              bVar8 = true;
            }
            else {
              iVar4 = bcmp((pDVar5->Id)._M_dataplus._M_p,(id->_M_dataplus)._M_p,__n);
              bVar8 = iVar4 == 0;
            }
          }
          else {
            bVar8 = false;
          }
          if (!bVar8) break;
          std::__cxx11::string::_M_assign((string *)&local_e0);
          lVar2 = *(long *)&(pDVar5->Command).Impl.
                            super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
          ;
          puVar3 = *(undefined8 **)(lVar2 + 0x58);
          for (puVar7 = *(undefined8 **)(lVar2 + 0x50); puVar7 != puVar3; puVar7 = puVar7 + 6) {
            local_60 = 1;
            local_50[0] = 0x3b;
            local_b0._M_len = local_e0._M_string_length;
            local_b0._M_str = local_e0._M_dataplus._M_p;
            local_a0 = 1;
            local_88 = *puVar7;
            local_90 = puVar7[1];
            views._M_len = 3;
            views._M_array = &local_b0;
            local_98 = local_50;
            local_58 = local_50;
            cmCatViews_abi_cxx11_(&local_80,views);
            std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          pDVar5 = pDVar5 + 1;
          pDVar6 = local_c0;
          id = local_b8;
          if (bVar8 || pDVar5 == local_c0) goto LAB_001b3e15;
        }
        pDVar5 = pDVar5 + 1;
      } while (pDVar5 != pDVar6);
    }
LAB_001b3e15:
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCall(std::string const& id) const
{
  cm::optional<std::string> call;
  if (this->Defer) {
    std::string tmp;
    for (DeferCommand const& dc : this->Defer->Commands) {
      if (dc.Id == id) {
        tmp = dc.Command.OriginalName();
        for (cmListFileArgument const& arg : dc.Command.Arguments()) {
          tmp = cmStrCat(tmp, ';', arg.Value);
        }
        break;
      }
    }
    call = std::move(tmp);
  }
  return call;
}